

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall
mp::internal::SolverAppOptionParser::SolverAppOptionParser
          (SolverAppOptionParser *this,BasicSolver *s)

{
  OptionList *this_00;
  
  (this->currentOptionString)._M_dataplus._M_p = (pointer)&(this->currentOptionString).field_2;
  (this->currentOptionString)._M_string_length = 0;
  (this->currentOptionString).field_2._M_local_buf[0] = '\0';
  this->solver_ = s;
  this_00 = &this->options_;
  (this->options_).options_.super__Vector_base<mp::Option,_std::allocator<mp::Option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_).options_.super__Vector_base<mp::Option,_std::allocator<mp::Option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options_).options_.super__Vector_base<mp::Option,_std::allocator<mp::Option>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options_).sorted_ = true;
  this->echo_solver_options_ = true;
  OptionList::
  Add<mp::internal::SolverAppOptionParser,_&mp::internal::SolverAppOptionParser::ShowUsage>
            (this_00,'?',"show usage and exit",this);
  OptionList::
  Add<mp::internal::SolverAppOptionParser,_&mp::internal::SolverAppOptionParser::EndOptions>
            (this_00,'-',"end of options",this);
  OptionList::
  AddWithParam<mp::internal::SolverAppOptionParser,_&mp::internal::SolverAppOptionParser::ShowSolverOptions>
            (this_00,'=',"show solver options and exit",this);
  OptionList::
  Add<mp::internal::SolverAppOptionParser,_&mp::internal::SolverAppOptionParser::ShowSolverOptionsASL>
            (this_00,'a',"show solver options (ASL style, 1st synonyms if provided) and exit",this);
  OptionList::
  Add<mp::internal::SolverAppOptionParser,_&mp::internal::SolverAppOptionParser::ShowSolveResults>
            (this_00,'!',"show solve result codes",this);
  OptionList::
  Add<mp::internal::SolverAppOptionParser,_&mp::internal::SolverAppOptionParser::DontEchoSolverOptions>
            (this_00,'e',"suppress echoing of assignments",this);
  OptionList::
  Add<mp::internal::SolverAppOptionParser,_&mp::internal::SolverAppOptionParser::WantSol>
            (this_00,'s',"write .sol file (without -AMPL)",this);
  OptionList::Add<mp::BasicSolver,_&mp::BasicSolver::ShowVersion>
            (this_00,'v',"show version and exit",s);
  OptionList::Add<mp::BasicSolver,_&mp::BasicSolver::ShowConstraintDescriptions>
            (this_00,'c',"show constraint descriptions and exit",s);
  return;
}

Assistant:

SolverAppOptionParser::SolverAppOptionParser(BasicSolver &s)
  : solver_(s), echo_solver_options_(true) {
  // Add standard command-line options.
  OptionList::Builder<SolverAppOptionParser> app_options(options_, *this);
  app_options.Add<&SolverAppOptionParser::ShowUsage>(
        '?', "show usage and exit");
  app_options.Add<&SolverAppOptionParser::EndOptions>('-', "end of options");
  app_options.AddWithParam<&SolverAppOptionParser::ShowSolverOptions>(
        '=', "show solver options and exit");
  app_options.Add<&SolverAppOptionParser::ShowSolverOptionsASL>(
    'a', "show solver options (ASL style, 1st synonyms if provided) and exit");
  app_options.Add<&SolverAppOptionParser::ShowSolveResults>(
    '!', "show solve result codes");
  app_options.Add<&SolverAppOptionParser::DontEchoSolverOptions>(
        'e', "suppress echoing of assignments");
  app_options.Add<&SolverAppOptionParser::WantSol>(
        's', "write .sol file (without -AMPL)");
  OptionList::Builder<mp::BasicSolver> options(options_, s);
  options.Add<&mp::BasicSolver::ShowVersion>('v', "show version and exit");
  options.Add<&mp::BasicSolver::ShowConstraintDescriptions>('c',
                                             "show constraint descriptions and exit");
  // TODO: if solver supports functions add options -ix and -u
  // "ix", "import user-defined functions from x; -i? gives details",
  // "u",  "just show available user-defined functions"
}